

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O3

string * __thiscall
glcts::GeometryShaderPrimitiveCounter::GetGeometryShaderCode
          (string *__return_storage_ptr__,GeometryShaderPrimitiveCounter *this,string *max_vertices,
          string *layout_in,string *layout_out,string *emit_vertices,string *n_iterations)

{
  ulong uVar1;
  long *local_50;
  char *local_48;
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\nlayout(<-LAYOUT-IN->)                                  in;\nlayout(<-LAYOUT-OUT->, max_vertices =<-MAX-VERTICES->) out;\n\nflat out int test_gl_PrimitiveIDIn;\n\nvoid main()\n{\n    for (int i=0; i<<-N_ITERATIONS->; i++)\n    {\n        <-EMIT-VERTICES->\n        EndPrimitive();\n    }\n}\n"
             ,"");
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"<-MAX-VERTICES->","");
  while (uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_50,0),
        uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar1,local_48,(ulong)(max_vertices->_M_dataplus)._M_p)
    ;
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x1b4f4ca);
  while (uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_50,0),
        uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar1,local_48,(ulong)(layout_in->_M_dataplus)._M_p);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x1b4f4d8);
  while (uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_50,0),
        uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar1,local_48,(ulong)(layout_out->_M_dataplus)._M_p);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x1b4f4e7);
  while (uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_50,0),
        uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar1,local_48,(ulong)(emit_vertices->_M_dataplus)._M_p
              );
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x1b4f4f9);
  uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_50,0);
  while (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar1,local_48,(ulong)(n_iterations->_M_dataplus)._M_p)
    ;
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_50,0);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderPrimitiveCounter::GetGeometryShaderCode(const std::string& max_vertices,
																  const std::string& layout_in,
																  const std::string& layout_out,
																  const std::string& emit_vertices,
																  const std::string& n_iterations)
{
	/* Geometry shader template code */
	std::string m_geometry_shader_template = "${VERSION}\n"
											 "\n"
											 "${GEOMETRY_SHADER_REQUIRE}\n"
											 "\n"
											 "precision highp float;\n"
											 "\n"
											 "layout(<-LAYOUT-IN->)                                  in;\n"
											 "layout(<-LAYOUT-OUT->, max_vertices =<-MAX-VERTICES->) out;\n"
											 "\n"
											 "flat out int test_gl_PrimitiveIDIn;\n"
											 "\n"
											 "void main()\n"
											 "{\n"
											 "    for (int i=0; i<<-N_ITERATIONS->; i++)\n"
											 "    {\n"
											 "        <-EMIT-VERTICES->\n"
											 "        EndPrimitive();\n"
											 "    }\n"
											 "}\n";

	/* Max number of emited vertices */
	std::string template_name	 = "<-MAX-VERTICES->";
	std::size_t template_position = m_geometry_shader_template.find(template_name);

	while (template_position != std::string::npos)
	{
		m_geometry_shader_template =
			m_geometry_shader_template.replace(template_position, template_name.length(), max_vertices);

		template_position = m_geometry_shader_template.find(template_name);
	}

	/* In primitive type */
	template_name	 = "<-LAYOUT-IN->";
	template_position = m_geometry_shader_template.find(template_name);

	while (template_position != std::string::npos)
	{
		m_geometry_shader_template =
			m_geometry_shader_template.replace(template_position, template_name.length(), layout_in);

		template_position = m_geometry_shader_template.find(template_name);
	}

	/* Out primitive type */
	template_name	 = "<-LAYOUT-OUT->";
	template_position = m_geometry_shader_template.find(template_name);

	while (template_position != std::string::npos)
	{
		m_geometry_shader_template =
			m_geometry_shader_template.replace(template_position, template_name.length(), layout_out);

		template_position = m_geometry_shader_template.find(template_name);
	}

	/* Vertex emit code */
	template_name	 = "<-EMIT-VERTICES->";
	template_position = m_geometry_shader_template.find(template_name);

	while (template_position != std::string::npos)
	{
		m_geometry_shader_template =
			m_geometry_shader_template.replace(template_position, template_name.length(), emit_vertices);

		template_position = m_geometry_shader_template.find(template_name);
	}

	/* Number of iterations, during which we'll be emitting vertices */
	template_name	 = "<-N_ITERATIONS->";
	template_position = m_geometry_shader_template.find(template_name);

	while (template_position != std::string::npos)
	{
		m_geometry_shader_template =
			m_geometry_shader_template.replace(template_position, template_name.length(), n_iterations);

		template_position = m_geometry_shader_template.find(template_name);
	}

	return m_geometry_shader_template;
}